

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

nn_transport * nn_global_transport(int id)

{
  nn_transport *pnVar1;
  nn_transport **ppnVar2;
  
  ppnVar2 = nn_transports;
  do {
    pnVar1 = *ppnVar2;
    if (pnVar1 == (nn_transport *)0x0) {
      return pnVar1;
    }
    ppnVar2 = ppnVar2 + 1;
  } while (pnVar1->id != id);
  return pnVar1;
}

Assistant:

const struct nn_transport *nn_global_transport (int id)
{
    const struct nn_transport *tp;
    int i;

    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->id == id)
            return tp;
    }
    return NULL;
}